

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void RenderText(Shader *shader,char *text,GLfloat x,GLfloat y,GLfloat scale,vec3 color)

{
  int iVar1;
  uint uVar2;
  PFNGLUNIFORM3FPROC p_Var3;
  _Alloc_hider _Var4;
  GLint GVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  long lVar8;
  GLfloat vertices [6] [4];
  wide_string str32;
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  cv;
  float local_140;
  undefined8 local_128;
  undefined8 local_120;
  float local_118;
  float local_114;
  undefined8 local_110;
  float local_108;
  float local_104;
  undefined8 local_100;
  float local_f8;
  float local_f4;
  undefined8 local_f0;
  float local_e8;
  float local_e4;
  undefined8 local_e0;
  float local_d8;
  float local_d4;
  undefined8 local_d0;
  wide_string local_c8;
  undefined8 local_a8;
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  local_90;
  
  local_a8 = color._0_8_;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::wstring_convert(&local_90);
  sVar6 = strlen(text);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::from_bytes(&local_c8,&local_90,text,text + sVar6);
  (*glad_glUseProgram)(shader->ID);
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"textColor","");
  p_Var3 = glad_glUniform3f;
  GVar5 = (*glad_glGetUniformLocation)(shader->ID,(GLchar *)local_128);
  (*p_Var3)(GVar5,(GLfloat)local_a8,local_a8._4_4_,color.field_2.z);
  if (local_128 != &local_118) {
    operator_delete(local_128);
  }
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindVertexArray)(VAO);
  _Var4._M_p = local_c8._M_dataplus._M_p;
  if (local_c8._M_string_length != 0) {
    lVar8 = 0;
    local_140 = x;
    do {
      local_128 = (float *)(ulong)*(uint *)((long)_Var4._M_p + lVar8);
      pmVar7 = std::
               map<unsigned_long,_Character,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Character>_>_>
               ::operator[](&Characters,&local_128);
      iVar1 = (pmVar7->Size).field_1.y;
      uVar2 = pmVar7->Advance;
      local_118 = (float)(pmVar7->Bearing).field_0.x * scale + local_140;
      local_114 = y - (float)(iVar1 - (pmVar7->Bearing).field_1.y) * scale;
      local_f4 = (float)iVar1 * scale + local_114;
      local_128 = (float *)CONCAT44(local_f4,local_118);
      local_120 = 0;
      local_110 = 0x3f80000000000000;
      local_108 = (float)(pmVar7->Size).field_0.x * scale + local_118;
      local_100 = 0x3f8000003f800000;
      local_f0 = 0;
      local_e0 = 0x3f8000003f800000;
      local_d0 = 0x3f800000;
      local_104 = local_114;
      local_f8 = local_118;
      local_e8 = local_108;
      local_e4 = local_114;
      local_d8 = local_108;
      local_d4 = local_f4;
      (*glad_glBindTexture)(0xde1,pmVar7->TextureID);
      (*glad_glBindBuffer)(0x8892,VBO);
      (*glad_glBufferSubData)(0x8892,0,0x60,&local_128);
      (*glad_glBindBuffer)(0x8892,0);
      (*glad_glDrawArrays)(4,0,6);
      local_140 = local_140 + (float)(uVar2 >> 6) * scale;
      lVar8 = lVar8 + 4;
    } while (local_c8._M_string_length << 2 != lVar8);
  }
  (*glad_glBindVertexArray)(0);
  (*glad_glBindTexture)(0xde1,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::~wstring_convert(&local_90);
  return;
}

Assistant:

void RenderText(Shader &shader, const char text[], GLfloat x, GLfloat y, GLfloat scale, glm::vec3 color) {
    std::wstring_convert<std::codecvt_utf8<wchar_t>, wchar_t> cv;
    auto str32 = cv.from_bytes(text);

    // Activate corresponding render state	
    shader.use();
    //glUniform3f(glGetUniformLocation(shader.Program, "textColor"), color.x, color.y, color.z);
	shader.setVec3("textColor", color.x, color.y, color.z);

    glActiveTexture(GL_TEXTURE0);
    glBindVertexArray(VAO);

    // Iterate through all characters
    //std::wstring::const_iterator c;
    //for (int i = 0; i < sizeof(text) / sizeof(const char*); ++i) {

    for(auto c : str32) {
        Character ch = Characters[uint_least32_t(c)];

        GLfloat xpos = x + ch.Bearing.x * scale;
        GLfloat ypos = y - (ch.Size.y - ch.Bearing.y) * scale;

        GLfloat w = ch.Size.x * scale;
        GLfloat h = ch.Size.y * scale;
        // Update VBO for each character
        GLfloat vertices[6][4] = {
            { xpos,     ypos + h,   0.0, 0.0 },            
            { xpos,     ypos,       0.0, 1.0 },
            { xpos + w, ypos,       1.0, 1.0 },

            { xpos,     ypos + h,   0.0, 0.0 },
            { xpos + w, ypos,       1.0, 1.0 },
            { xpos + w, ypos + h,   1.0, 0.0 }           
        };
        // Render glyph texture over quad
        glBindTexture(GL_TEXTURE_2D, ch.TextureID);
        // Update content of VBO memory
        glBindBuffer(GL_ARRAY_BUFFER, VBO);
        glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(vertices), vertices); // Be sure to use glBufferSubData and not glBufferData

        glBindBuffer(GL_ARRAY_BUFFER, 0);
        // Render quad
        glDrawArrays(GL_TRIANGLES, 0, 6);
        // Now advance cursors for next glyph (note that advance is number of 1/64 pixels)
        x += (ch.Advance >> 6) * scale; // Bitshift by 6 to get value in pixels (2^6 = 64 (divide amount of 1/64th pixels by 64 to get amount of pixels))
    }
    glBindVertexArray(0);
    glBindTexture(GL_TEXTURE_2D, 0);
}